

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_text_write.cpp
# Opt level: O2

void __thiscall ritobin::io::text_write_impl::TextWriter::write_hex(TextWriter *this,uint32_t hex)

{
  size_t i;
  ulong uVar1;
  string_view str;
  char result [10];
  
  result[8] = '\0';
  result[9] = '\0';
  result[0] = '0';
  result[1] = 'x';
  result[2] = '\0';
  result[3] = '\0';
  result[4] = '\0';
  result[5] = '\0';
  result[6] = '\0';
  result[7] = '\0';
  for (uVar1 = 9; 1 < uVar1; uVar1 = uVar1 - 1) {
    result[uVar1] = "0123456789abcdef"[hex & 0xf];
    hex = hex >> 4;
  }
  str._M_str = result;
  str._M_len = 10;
  write_raw(this,str);
  return;
}

Assistant:

void write_hex(uint32_t hex) noexcept {
            constexpr char digits[] = "0123456789abcdef";
            char result[10] = { '0', 'x' };
            for (size_t i = 9; i > 1; i--) {
                result[i] = digits[hex & 0x0Fu];
                hex >>= 4;
            }
            write_raw(std::string_view{ result, sizeof(result) });
        }